

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

string * __thiscall
cmLocalGenerator::GetIncludeFlags
          (string *__return_storage_ptr__,cmLocalGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *includeDirs,cmGeneratorTarget *target,string *lang,bool forceFullPaths,
          bool forResponseFile,string *config)

{
  cmMakefile *pcVar1;
  OutputFormat output;
  bool bVar2;
  ulong uVar3;
  char *pcVar4;
  ostream *poVar5;
  char *pcVar6;
  undefined1 *puVar7;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar8;
  bool local_4a1;
  string local_3f8 [8];
  string includePath;
  string local_398;
  undefined1 local_378 [8];
  string frameworkDir;
  string local_350;
  reference local_330;
  string *i;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  bool flagUsed;
  char *sysFwSearchFlag;
  undefined1 local_2c8 [8];
  string sysFwSearchFlagVar;
  char *fwSearchFlag;
  undefined1 local_298 [8];
  string fwSearchFlagVar;
  char *sysIncludeFlag;
  undefined1 local_268 [8];
  string sysFlagVar;
  undefined1 local_240 [6];
  bool repeatFlag;
  byte local_219;
  char *pcStack_218;
  bool quotePaths;
  char *sep;
  string *includeFlag;
  undefined1 local_200 [8];
  string flagVar;
  ostringstream includeFlags;
  undefined1 local_60 [4];
  OutputFormat shellFormat;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  allocator<char> local_33;
  byte local_32;
  byte local_31;
  bool forResponseFile_local;
  string *psStack_30;
  bool forceFullPaths_local;
  string *lang_local;
  cmGeneratorTarget *target_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *includeDirs_local;
  cmLocalGenerator *this_local;
  string *flags;
  
  local_32 = forResponseFile;
  local_31 = forceFullPaths;
  psStack_30 = lang;
  lang_local = (string *)target;
  target_local = (cmGeneratorTarget *)includeDirs;
  includeDirs_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  this_local = (cmLocalGenerator *)__return_storage_ptr__;
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_60,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)target_local);
    MoveSystemIncludesToEnd
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_60,config,psStack_30,(cmGeneratorTarget *)lang_local);
    output = (local_32 & 1) * 2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(flagVar.field_2._M_local_buf + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_200,"CMAKE_INCLUDE_FLAG_",(allocator<char> *)((long)&includeFlag + 7)
              );
    std::allocator<char>::~allocator((allocator<char> *)((long)&includeFlag + 7));
    std::__cxx11::string::operator+=((string *)local_200,(string *)psStack_30);
    sep = (char *)cmMakefile::GetSafeDefinition(this->Makefile,(string *)local_200);
    std::__cxx11::string::operator=((string *)local_200,"CMAKE_INCLUDE_FLAG_SEP_");
    std::__cxx11::string::operator+=((string *)local_200,(string *)psStack_30);
    pcStack_218 = cmMakefile::GetDefinition(this->Makefile,(string *)local_200);
    local_219 = 0;
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_240,"CMAKE_QUOTE_INCLUDE_PATHS",
               (allocator<char> *)(sysFlagVar.field_2._M_local_buf + 0xf));
    pcVar4 = cmMakefile::GetDefinition(pcVar1,(string *)local_240);
    std::__cxx11::string::~string((string *)local_240);
    std::allocator<char>::~allocator((allocator<char> *)(sysFlagVar.field_2._M_local_buf + 0xf));
    if (pcVar4 != (char *)0x0) {
      local_219 = 1;
    }
    sysFlagVar.field_2._M_local_buf[0xe] = pcStack_218 == (char *)0x0;
    if ((bool)sysFlagVar.field_2._M_local_buf[0xe]) {
      pcStack_218 = " ";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_268,"CMAKE_INCLUDE_SYSTEM_FLAG_",
               (allocator<char> *)((long)&sysIncludeFlag + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&sysIncludeFlag + 7));
    std::__cxx11::string::operator+=((string *)local_268,(string *)psStack_30);
    fwSearchFlagVar.field_2._8_8_ = 0;
    if ((sysFlagVar.field_2._M_local_buf[0xe] & 1U) != 0) {
      fwSearchFlagVar.field_2._8_8_ = cmMakefile::GetDefinition(this->Makefile,(string *)local_268);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_298,"CMAKE_",(allocator<char> *)((long)&fwSearchFlag + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&fwSearchFlag + 7));
    std::__cxx11::string::operator+=((string *)local_298,(string *)psStack_30);
    std::__cxx11::string::operator+=((string *)local_298,"_FRAMEWORK_SEARCH_FLAG");
    sysFwSearchFlagVar.field_2._8_8_ = cmMakefile::GetDefinition(this->Makefile,(string *)local_298)
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_2c8,"CMAKE_",(allocator<char> *)((long)&sysFwSearchFlag + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&sysFwSearchFlag + 7));
    std::__cxx11::string::operator+=((string *)local_2c8,(string *)psStack_30);
    std::__cxx11::string::operator+=((string *)local_2c8,"_SYSTEM_FRAMEWORK_SEARCH_FLAG");
    pcVar4 = cmMakefile::GetDefinition(this->Makefile,(string *)local_2c8);
    emitted._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 0;
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&__range1);
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_60);
    i = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_60);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&i), bVar2) {
      local_330 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end1);
      frameworkDir.field_2._M_local_buf[0xe] = '\0';
      frameworkDir.field_2._M_local_buf[0xd] = '\0';
      local_4a1 = false;
      if ((sysFwSearchFlagVar.field_2._8_8_ != 0) &&
         (local_4a1 = false, *(char *)sysFwSearchFlagVar.field_2._8_8_ != '\0')) {
        pcVar1 = this->Makefile;
        std::allocator<char>::allocator();
        frameworkDir.field_2._M_local_buf[0xe] = '\x01';
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_350,"APPLE",
                   (allocator<char> *)(frameworkDir.field_2._M_local_buf + 0xf));
        frameworkDir.field_2._M_local_buf[0xd] = '\x01';
        bVar2 = cmMakefile::IsOn(pcVar1,&local_350);
        local_4a1 = false;
        if (bVar2) {
          local_4a1 = cmSystemTools::IsPathToFramework(local_330);
        }
      }
      if ((frameworkDir.field_2._M_local_buf[0xd] & 1U) != 0) {
        std::__cxx11::string::~string((string *)&local_350);
      }
      if ((frameworkDir.field_2._M_local_buf[0xe] & 1U) != 0) {
        std::allocator<char>::~allocator
                  ((allocator<char> *)(frameworkDir.field_2._M_local_buf + 0xf));
      }
      if (local_4a1 == false) {
        if (((emitted._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) == 0) ||
           ((sysFlagVar.field_2._M_local_buf[0xe] & 1U) != 0)) {
          if ((fwSearchFlagVar.field_2._8_8_ == 0) ||
             ((lang_local == (string *)0x0 ||
              (bVar2 = cmGeneratorTarget::IsSystemIncludeDirectory
                                 ((cmGeneratorTarget *)lang_local,local_330,config,psStack_30),
              !bVar2)))) {
            std::operator<<((ostream *)((long)&flagVar.field_2 + 8),(string *)sep);
          }
          else {
            std::operator<<((ostream *)((long)&flagVar.field_2 + 8),
                            (char *)fwSearchFlagVar.field_2._8_8_);
          }
          emitted._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = 1;
        }
        (*this->_vptr_cmLocalGenerator[9])
                  (local_3f8,this,local_330,(ulong)output,(ulong)(local_31 & 1));
        if ((((local_219 & 1) != 0) && (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) == 0)) &&
           (pcVar6 = (char *)std::__cxx11::string::front(), *pcVar6 != '\"')) {
          std::operator<<((ostream *)((long)&flagVar.field_2 + 8),"\"");
        }
        std::operator<<((ostream *)((long)&flagVar.field_2 + 8),local_3f8);
        if ((((local_219 & 1) != 0) && (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) == 0)) &&
           (pcVar6 = (char *)std::__cxx11::string::front(), *pcVar6 != '\"')) {
          std::operator<<((ostream *)((long)&flagVar.field_2 + 8),"\"");
        }
        std::operator<<((ostream *)((long)&flagVar.field_2 + 8),pcStack_218);
        std::__cxx11::string::~string(local_3f8);
      }
      else {
        std::__cxx11::string::string((string *)local_378,(string *)local_330);
        std::__cxx11::string::operator+=((string *)local_378,"/../");
        cmsys::SystemTools::CollapseFullPath(&local_398,(string *)local_378);
        std::__cxx11::string::operator=((string *)local_378,(string *)&local_398);
        std::__cxx11::string::~string((string *)&local_398);
        pVar8 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__range1,(value_type *)local_378);
        if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          if (((pcVar4 == (char *)0x0) || (lang_local == (string *)0x0)) ||
             (bVar2 = cmGeneratorTarget::IsSystemIncludeDirectory
                                ((cmGeneratorTarget *)lang_local,local_330,config,psStack_30),
             !bVar2)) {
            std::operator<<((ostream *)((long)&flagVar.field_2 + 8),
                            (char *)sysFwSearchFlagVar.field_2._8_8_);
          }
          else {
            std::operator<<((ostream *)((long)&flagVar.field_2 + 8),pcVar4);
          }
          cmOutputConverter::ConvertToOutputFormat
                    ((string *)((long)&includePath.field_2 + 8),&this->super_cmOutputConverter,
                     (string *)local_378,output);
          poVar5 = std::operator<<((ostream *)((long)&flagVar.field_2 + 8),
                                   (string *)(includePath.field_2._M_local_buf + 8));
          std::operator<<(poVar5," ");
          std::__cxx11::string::~string((string *)(includePath.field_2._M_local_buf + 8));
        }
        std::__cxx11::string::~string((string *)local_378);
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    std::__cxx11::ostringstream::str();
    if (((*pcStack_218 != ' ') && (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) == 0)) &&
       (pcVar4 = (char *)std::__cxx11::string::back(), *pcVar4 == *pcStack_218)) {
      puVar7 = (undefined1 *)std::__cxx11::string::back();
      *puVar7 = 0x20;
    }
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range1);
    std::__cxx11::string::~string((string *)local_2c8);
    std::__cxx11::string::~string((string *)local_298);
    std::__cxx11::string::~string((string *)local_268);
    std::__cxx11::string::~string((string *)local_200);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)(flagVar.field_2._M_local_buf + 8))
    ;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_60);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_33);
    std::allocator<char>::~allocator(&local_33);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalGenerator::GetIncludeFlags(
  const std::vector<std::string>& includeDirs, cmGeneratorTarget* target,
  const std::string& lang, bool forceFullPaths, bool forResponseFile,
  const std::string& config)
{
  if (lang.empty()) {
    return "";
  }

  std::vector<std::string> includes = includeDirs;
  MoveSystemIncludesToEnd(includes, config, lang, target);

  OutputFormat shellFormat = forResponseFile ? RESPONSE : SHELL;
  std::ostringstream includeFlags;

  std::string flagVar = "CMAKE_INCLUDE_FLAG_";
  flagVar += lang;
  std::string const& includeFlag = this->Makefile->GetSafeDefinition(flagVar);
  flagVar = "CMAKE_INCLUDE_FLAG_SEP_";
  flagVar += lang;
  const char* sep = this->Makefile->GetDefinition(flagVar);
  bool quotePaths = false;
  if (this->Makefile->GetDefinition("CMAKE_QUOTE_INCLUDE_PATHS")) {
    quotePaths = true;
  }
  bool repeatFlag = true;
  // should the include flag be repeated like ie. -IA -IB
  if (!sep) {
    sep = " ";
  } else {
    // if there is a separator then the flag is not repeated but is only
    // given once i.e.  -classpath a:b:c
    repeatFlag = false;
  }

  // Support special system include flag if it is available and the
  // normal flag is repeated for each directory.
  std::string sysFlagVar = "CMAKE_INCLUDE_SYSTEM_FLAG_";
  sysFlagVar += lang;
  const char* sysIncludeFlag = nullptr;
  if (repeatFlag) {
    sysIncludeFlag = this->Makefile->GetDefinition(sysFlagVar);
  }

  std::string fwSearchFlagVar = "CMAKE_";
  fwSearchFlagVar += lang;
  fwSearchFlagVar += "_FRAMEWORK_SEARCH_FLAG";
  const char* fwSearchFlag = this->Makefile->GetDefinition(fwSearchFlagVar);

  std::string sysFwSearchFlagVar = "CMAKE_";
  sysFwSearchFlagVar += lang;
  sysFwSearchFlagVar += "_SYSTEM_FRAMEWORK_SEARCH_FLAG";
  const char* sysFwSearchFlag =
    this->Makefile->GetDefinition(sysFwSearchFlagVar);

  bool flagUsed = false;
  std::set<std::string> emitted;
#ifdef __APPLE__
  emitted.insert("/System/Library/Frameworks");
#endif
  for (std::string const& i : includes) {
    if (fwSearchFlag && *fwSearchFlag && this->Makefile->IsOn("APPLE") &&
        cmSystemTools::IsPathToFramework(i)) {
      std::string frameworkDir = i;
      frameworkDir += "/../";
      frameworkDir = cmSystemTools::CollapseFullPath(frameworkDir);
      if (emitted.insert(frameworkDir).second) {
        if (sysFwSearchFlag && target &&
            target->IsSystemIncludeDirectory(i, config, lang)) {
          includeFlags << sysFwSearchFlag;
        } else {
          includeFlags << fwSearchFlag;
        }
        includeFlags << this->ConvertToOutputFormat(frameworkDir, shellFormat)
                     << " ";
      }
      continue;
    }

    if (!flagUsed || repeatFlag) {
      if (sysIncludeFlag && target &&
          target->IsSystemIncludeDirectory(i, config, lang)) {
        includeFlags << sysIncludeFlag;
      } else {
        includeFlags << includeFlag;
      }
      flagUsed = true;
    }
    std::string includePath =
      this->ConvertToIncludeReference(i, shellFormat, forceFullPaths);
    if (quotePaths && !includePath.empty() && includePath.front() != '\"') {
      includeFlags << "\"";
    }
    includeFlags << includePath;
    if (quotePaths && !includePath.empty() && includePath.front() != '\"') {
      includeFlags << "\"";
    }
    includeFlags << sep;
  }
  std::string flags = includeFlags.str();
  // remove trailing separators
  if ((sep[0] != ' ') && !flags.empty() && flags.back() == sep[0]) {
    flags.back() = ' ';
  }
  return flags;
}